

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

realtype N_VWrmsNormMask_SensWrapper(N_Vector x,N_Vector w,N_Vector id)

{
  long *in_RDI;
  realtype tmp;
  realtype nrm;
  int i;
  N_Vector in_stack_ffffffffffffffd0;
  N_Vector w_00;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  w_00 = (N_Vector)0x0;
  for (iVar1 = 0; iVar1 < *(int *)(*in_RDI + 8); iVar1 = iVar1 + 1) {
    in_stack_ffffffffffffffd0 =
         (N_Vector)
         N_VWrmsNormMask((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffe0),w_00,
                         in_stack_ffffffffffffffd0);
    if ((double)w_00 < (double)in_stack_ffffffffffffffd0) {
      w_00 = in_stack_ffffffffffffffd0;
    }
  }
  return (realtype)w_00;
}

Assistant:

realtype N_VWrmsNormMask_SensWrapper(N_Vector x, N_Vector w, N_Vector id)
{
  int i;
  realtype nrm, tmp;

  nrm = ZERO;

  for (i=0; i < NV_NVECS_SW(x); i++) {
    tmp = N_VWrmsNormMask(NV_VEC_SW(x,i), NV_VEC_SW(w,i), NV_VEC_SW(id,i));
    if (tmp > nrm) nrm = tmp;
  }

  return(nrm);
}